

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa_util.cpp
# Opt level: O1

bool spvtools::opt::anon_unknown_0::HasDescriptorDecorations(IRContext *context,Instruction *var)

{
  DecorationManager *this;
  bool bVar1;
  uint32_t uVar2;
  
  if ((context->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    IRContext::BuildDecorationManager(context);
  }
  this = (context->decoration_mgr_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
         .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl;
  uVar2 = 0;
  if (var->has_result_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
  }
  bVar1 = analysis::DecorationManager::HasDecoration(this,uVar2,0x22);
  if (bVar1) {
    uVar2 = 0;
    if (var->has_result_id_ == true) {
      uVar2 = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
    }
    bVar1 = analysis::DecorationManager::HasDecoration(this,uVar2,0x21);
    return bVar1;
  }
  return false;
}

Assistant:

bool HasDescriptorDecorations(IRContext* context, Instruction* var) {
  const auto& decoration_mgr = context->get_decoration_mgr();
  return decoration_mgr->HasDecoration(
             var->result_id(), uint32_t(spv::Decoration::DescriptorSet)) &&
         decoration_mgr->HasDecoration(var->result_id(),
                                       uint32_t(spv::Decoration::Binding));
}